

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepExporter.cpp
# Opt level: O1

void Assimp::ExportSceneStep
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *pProperties)

{
  _Alloc_hider _Var1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 uVar4;
  runtime_error *this;
  string file;
  string path;
  ExportProperties props;
  StepExporter iDoTheExportThing;
  allocator<char> local_3d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  string local_3b0;
  string local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  ExportProperties local_350;
  undefined1 local_290 [128];
  ios_base local_210 [280];
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Rb_tree<const_aiNode_*,_std::pair<const_aiNode_*const,_aiMatrix4x4t<float>_>,_std::_Select1st<std::pair<const_aiNode_*const,_aiMatrix4x4t<float>_>_>,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_aiMatrix4x4t<float>_>_>_>
  local_90;
  _Rb_tree<const_aiNode_*,_std::pair<const_aiNode_*const,_unsigned_int>,_std::_Select1st<std::pair<const_aiNode_*const,_unsigned_int>_>,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_unsigned_int>_>_>
  local_60;
  long *plVar3;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_290,pFile,(allocator<char> *)&local_350);
  DefaultIOSystem::absolutePath(&local_390,(string *)local_290);
  if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
    operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_290,pFile,(allocator<char> *)&local_350);
  DefaultIOSystem::completeBaseName(&local_3b0,(string *)local_290);
  if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
    operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
  }
  ExportProperties::ExportProperties(&local_350,pProperties);
  StepExporter::StepExporter
            ((StepExporter *)local_290,pScene,pIOSystem,&local_390,&local_3b0,&local_350);
  iVar2 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wt");
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  if (plVar3 != (long *)0x0) {
    std::__cxx11::stringbuf::str();
    _Var1._M_p = local_3d0._M_dataplus._M_p;
    uVar4 = std::ostream::tellp();
    (**(code **)(*plVar3 + 0x18))(plVar3,_Var1._M_p,uVar4,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
    }
    (**(code **)(*plVar3 + 8))(plVar3);
    std::
    _Rb_tree<const_aiNode_*,_std::pair<const_aiNode_*const,_unsigned_int>,_std::_Select1st<std::pair<const_aiNode_*const,_unsigned_int>_>,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_unsigned_int>_>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<const_aiNode_*,_std::pair<const_aiNode_*const,_aiMatrix4x4t<float>_>,_std::_Select1st<std::pair<const_aiNode_*const,_aiMatrix4x4t<float>_>_>,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_aiMatrix4x4t<float>_>_>_>
    ::~_Rb_tree(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_p != &local_a0) {
      operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != &local_c8) {
      operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_p != &local_e8) {
      operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_290);
    std::ios_base::~ios_base(local_210);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
    ::~_Rb_tree(&local_350.mMatrixProperties._M_t);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_350.mStringProperties._M_t);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::_Select1st<std::pair<const_unsigned_int,_float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
    ::~_Rb_tree(&local_350.mFloatProperties._M_t);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                 *)&local_350);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,pFile,&local_3d1);
  std::operator+(&local_3d0,"could not open output .stp file: ",&local_370);
  std::runtime_error::runtime_error(this,(string *)&local_3d0);
  *(undefined ***)this = &PTR__runtime_error_0082bce0;
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ExportSceneStep(const char* pFile,IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* pProperties)
{
    std::string path = DefaultIOSystem::absolutePath(std::string(pFile));
    std::string file = DefaultIOSystem::completeBaseName(std::string(pFile));

    // create/copy Properties
    ExportProperties props(*pProperties);

    // invoke the exporter
    StepExporter iDoTheExportThing( pScene, pIOSystem, path, file, &props);

    // we're still here - export successfully completed. Write result to the given IOSYstem
    std::unique_ptr<IOStream> outfile (pIOSystem->Open(pFile,"wt"));
    if(outfile == NULL) {
        throw DeadlyExportError("could not open output .stp file: " + std::string(pFile));
    }

    // XXX maybe use a small wrapper around IOStream that behaves like std::stringstream in order to avoid the extra copy.
    outfile->Write( iDoTheExportThing.mOutput.str().c_str(), static_cast<size_t>(iDoTheExportThing.mOutput.tellp()),1);
}